

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::~SubdivMesh(SubdivMesh *this)

{
  char *ptr;
  MemoryMonitorInterface *pMVar1;
  size_t sVar2;
  uint *puVar3;
  RawBufferView *pRVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  Topology *pTVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_021e0b20;
  std::unique_ptr<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>::~unique_ptr
            (&this->edgeCreaseMap);
  std::unique_ptr<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>::
  ~unique_ptr(&this->vertexCreaseMap);
  std::
  _Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ::~_Vector_base(&(this->patch_eval_trees).
                   super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
                 );
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_attrib_buffer_tags);
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_buffer_tags);
  uVar7 = (this->invalid_face).size_alloced;
  ptr = (this->invalid_face).items;
  if (ptr == (char *)0x0) {
LAB_005afcbb:
    if (uVar7 == 0) goto LAB_005afcd5;
  }
  else {
    if (uVar7 < 0x1c00000) {
      alignedFree(ptr);
      goto LAB_005afcbb;
    }
    os_free(ptr,uVar7,(this->invalid_face).alloc.hugepages);
  }
  pMVar1 = (this->invalid_face).alloc.device;
  (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,-uVar7,1);
LAB_005afcd5:
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  std::unique_ptr<embree::HoleSet,_std::default_delete<embree::HoleSet>_>::~unique_ptr
            (&this->holeSet);
  sVar2 = (this->halfEdgeFace).size_alloced;
  puVar3 = (this->halfEdgeFace).items;
  if (puVar3 != (uint *)0x0) {
    if (sVar2 * 4 < 0x1c00000) {
      alignedFree(puVar3);
    }
    else {
      os_free(puVar3,sVar2 * 4,(this->halfEdgeFace).alloc.hugepages);
    }
  }
  if (sVar2 != 0) {
    pMVar1 = (this->halfEdgeFace).alloc.device;
    (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,sVar2 * -4,1);
  }
  (this->halfEdgeFace).items = (uint *)0x0;
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  sVar2 = (this->faceStartEdge).size_alloced;
  puVar3 = (this->faceStartEdge).items;
  if (puVar3 != (uint *)0x0) {
    if (sVar2 * 4 < 0x1c00000) {
      alignedFree(puVar3);
    }
    else {
      os_free(puVar3,sVar2 * 4,(this->faceStartEdge).alloc.hugepages);
    }
  }
  if (sVar2 != 0) {
    pMVar1 = (this->faceStartEdge).alloc.device;
    (**pMVar1->_vptr_MemoryMonitorInterface)(pMVar1,sVar2 * -4,1);
  }
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->faceStartEdge).items = (uint *)0x0;
  RawBufferView::~RawBufferView(&(this->holes).super_RawBufferView);
  RawBufferView::~RawBufferView(&(this->levels).super_RawBufferView);
  RawBufferView::~RawBufferView(&(this->vertex_crease_weights).super_RawBufferView);
  RawBufferView::~RawBufferView(&(this->vertex_creases).super_RawBufferView);
  RawBufferView::~RawBufferView(&(this->edge_crease_weights).super_RawBufferView);
  RawBufferView::~RawBufferView(&(this->edge_creases).super_RawBufferView);
  lVar8 = 0;
  for (uVar7 = 0; pRVar4 = (this->vertexAttribs).items, uVar7 < (this->vertexAttribs).size_active;
      uVar7 = uVar7 + 1) {
    RawBufferView::~RawBufferView((RawBufferView *)((long)&pRVar4->ptr_ofs + lVar8));
    lVar8 = lVar8 + 0x38;
  }
  ::operator_delete(pRVar4);
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  lVar8 = 0;
  for (uVar7 = 0; pBVar5 = (this->vertices).items, uVar7 < (this->vertices).size_active;
      uVar7 = uVar7 + 1) {
    RawBufferView::~RawBufferView
              ((RawBufferView *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar8));
    lVar8 = lVar8 + 0x38;
  }
  ::operator_delete(pBVar5);
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  lVar8 = 0;
  for (uVar7 = 0; pTVar6 = (this->topology).items, uVar7 < (this->topology).size_active;
      uVar7 = uVar7 + 1) {
    Topology::~Topology((Topology *)((long)&pTVar6->mesh + lVar8));
    lVar8 = lVar8 + 0xa0;
  }
  ::operator_delete(pTVar6);
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  RawBufferView::~RawBufferView(&(this->faceVertices).super_RawBufferView);
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

SubdivMesh::~SubdivMesh() {}